

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,bool *i)

{
  bool bVar1;
  qint64 qVar2;
  long in_FS_OFFSET;
  char c;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dev == (QIODevice *)0x0) {
    bVar1 = false;
  }
  else {
    local_21 = -0x56;
    qVar2 = readBlock(this,&local_21,1);
    bVar1 = local_21 != '\0' && qVar2 == 1;
  }
  *i = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator>>(bool &i)
{
    qint8 v;
    *this >> v;
    i = !!v;
    return *this;
}